

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

bool __thiscall
SatPos::Calculatetk(SatPos *this,SATTIME ObsTime,SATTIME RefTime,NavSys flag,double *tk)

{
  double *this_00;
  double extraout_XMM0_Qa;
  SATTIME SVar1;
  double local_80;
  double expired;
  SATTIME tk_GPST;
  undefined1 local_58 [8];
  SATTIME RefTime_GPST;
  double *tk_local;
  NavSys flag_local;
  SatPos *this_local;
  SATTIME RefTime_local;
  SATTIME ObsTime_local;
  
  RefTime_local._0_8_ = RefTime.SOW;
  RefTime_local.SOW._0_4_ = ObsTime.Week;
  RefTime_GPST.SOW = (double)tk;
  SATTIME::SATTIME((SATTIME *)local_58);
  if (flag == BDS) {
    SVar1._4_4_ = 0;
    SVar1.Week = RefTime.Week;
    SVar1.SOW = (double)RefTime_local._0_8_;
    BDST2GPST(SVar1,(SATTIME *)local_58);
  }
  else if (flag == GPS) {
    local_58._4_4_ = this_local._4_4_;
    local_58._0_4_ = RefTime.Week;
    RefTime_GPST.Week = RefTime_local.Week;
    RefTime_GPST._4_4_ = RefTime_local._4_4_;
  }
  this_00 = &RefTime_local.SOW;
  SVar1 = SATTIME::operator-((SATTIME *)this_00,(SATTIME *)local_58);
  *(double *)RefTime_GPST.SOW = (double)(SVar1.Week * 0x93a80) + SVar1.SOW;
  if (flag == GPS) {
    local_80 = 7200.0;
  }
  else if (flag == BDS) {
    local_80 = 3600.0;
  }
  else {
    local_80 = 0.0;
  }
  std::abs((int)this_00);
  return extraout_XMM0_Qa <= local_80;
}

Assistant:

bool SatPos::Calculatetk(const SATTIME ObsTime, const SATTIME RefTime, NavSys flag, double &tk)
{
    SATTIME RefTime_GPST;
    if(flag == BDS)
        BDST2GPST(RefTime, RefTime_GPST);
    else if(flag == GPS)
        RefTime_GPST = RefTime;

    SATTIME tk_GPST = ObsTime - RefTime_GPST;
    tk = tk_GPST.Week * 604800 + tk_GPST.SOW;
    // 星历有效期
    double expired;
    if(flag == GPS)
        expired = 2 * 3600;
    else if(flag == BDS)
        expired = 3600;
    else
        expired = 0;
    
    if(abs(tk) > expired)
        return false;
    return true;
}